

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

line_data_t * kiste::parse_line(line_data_t *__return_storage_ptr__,parse_context *ctx)

{
  string *line;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  initializer_list<kiste::segment_t> __l;
  allocator_type local_e9;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> local_68;
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> local_50;
  
  line = &ctx->_line;
  lVar2 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6);
  if (lVar2 == -1) {
    if ((ctx->_class_curly_level != 0) && (ctx->_class_curly_level < ctx->_curly_level)) {
      parse_text_line(__return_storage_ptr__,ctx,line);
      return __return_storage_ptr__;
    }
    memset(__return_storage_ptr__,0,0xa0);
    line_data_t::line_data_t(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&rest,(ulong)line);
  pcVar3 = (char *)std::__cxx11::string::at((ulong)line);
  if (*pcVar3 == '$') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"class",(allocator<char> *)&local_88);
    bVar1 = starts_with(&rest,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    if (bVar1) {
      parse_class((class_t *)local_e8,ctx,&rest);
      line_data_t::line_data_t(__return_storage_ptr__,(class_t *)local_e8);
      class_t::~class_t((class_t *)local_e8);
      goto LAB_001061f2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"endclass",(allocator<char> *)&local_88);
    bVar1 = starts_with(&rest,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    if (bVar1) {
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = (pointer)0x0;
      local_d8[0]._M_allocated_capacity = (pointer)0x0;
      line_data_t::line_data_t
                (__return_storage_ptr__,class_end,
                 (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_e8);
      std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
                ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_e8);
      goto LAB_001061f2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"member",(allocator<char> *)&local_88);
    bVar1 = starts_with(&rest,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    if (bVar1) {
      parse_class_member((member_t *)local_e8,ctx,&rest);
      line_data_t::line_data_t(__return_storage_ptr__,(member_t *)local_e8);
      member_t::~member_t((member_t *)local_e8);
      goto LAB_001061f2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"|",(allocator<char> *)&local_88);
    bVar1 = starts_with(&rest,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    if (!bVar1) goto LAB_001061e4;
    std::__cxx11::string::substr((ulong)local_e8,(ulong)line);
    parse_text_line(__return_storage_ptr__,ctx,(string *)local_e8);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  }
  else {
    if (*pcVar3 != '%') {
LAB_001061e4:
      parse_text_line(__return_storage_ptr__,ctx,line);
      goto LAB_001061f2;
    }
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
    std::__cxx11::string::substr((ulong)&local_88,(ulong)line);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)line);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e8 + 0x10),&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    __l._M_len = 1;
    __l._M_array = (iterator)local_e8;
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
              (&local_68,__l,&local_e9);
    line_data_t::line_data_t(__return_storage_ptr__,cpp,&local_68);
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector(&local_68);
    std::__cxx11::string::~string((string *)(local_e8 + 0x10));
    std::__cxx11::string::~string((string *)&local_50);
    this = &local_88;
  }
  std::__cxx11::string::~string((string *)this);
LAB_001061f2:
  std::__cxx11::string::~string((string *)&rest);
  return __return_storage_ptr__;
}

Assistant:

auto parse_line(const parse_context& ctx) -> line_data_t
  {
    const auto pos_first_char = ctx._line.find_first_not_of(" \t");
    if (pos_first_char == ctx._line.npos)
    {
      if (ctx._class_curly_level and ctx._curly_level > ctx._class_curly_level)
      {
        return parse_text_line(ctx, ctx._line);
      }
      else
      {
        return line_data_t{};
      }
    }
    else
    {
      const auto rest = ctx._line.substr(pos_first_char + 1);
      switch (ctx._line.at(pos_first_char))
      {
      case '%':  // cpp line
        return line_data_t{line_type::cpp,
                           std::vector<segment_t>{{0,
                                                   segment_type::cpp,
                                                   ctx._line.substr(0, pos_first_char) +
                                                       ctx._line.substr(pos_first_char + 1)}}};
        break;
      case '$':  // opening / closing class or text line
        if (starts_with(rest, "class"))
        {
          return {parse_class(ctx, rest)};
        }
        else if (starts_with(rest, "endclass"))
        {
          return {line_type::class_end, {}};
        }
        else if (starts_with(rest, "member"))
        {
          return parse_class_member(ctx, rest);
        }
        else if (starts_with(rest, "|"))  // trim left
        {
          return parse_text_line(ctx, ctx._line.substr(pos_first_char + 2));
        }
        else
        {
          return parse_text_line(ctx, ctx._line);
        }
        break;
      default:
        return parse_text_line(ctx, ctx._line);
      }
    }
  }